

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::AssemblyContext::binaryEncodeNumericLiteral
          (AssemblyContext *this,char *val,spv_result_t error_code,IdType *type,
          spv_instruction_t *pInst)

{
  spv_result_t sVar1;
  uint32_t uVar2;
  EncodeNumberStatus EVar3;
  char *pcVar4;
  DiagnosticStream *pDVar5;
  DiagnosticStream local_a10;
  DiagnosticStream local_838;
  DiagnosticStream local_660;
  DiagnosticStream local_488;
  undefined4 local_2ac;
  anon_class_16_2_f84663c3 local_2a8;
  function<void_(unsigned_int)> local_298;
  EncodeNumberStatus local_274;
  undefined1 local_270 [4];
  EncodeNumberStatus parse_status;
  string error_msg;
  uint32_t bitwidth;
  DiagnosticStream local_218;
  NumberType local_40;
  NumberType number_type;
  spv_instruction_t *pInst_local;
  IdType *type_local;
  spv_result_t error_code_local;
  char *val_local;
  AssemblyContext *this_local;
  
  number_type = (NumberType)pInst;
  switch(type->type_class) {
  case kBottom:
    uVar2 = assumedBitWidth(type);
    pcVar4 = strchr(val,0x2e);
    if (pcVar4 == (char *)0x0) {
      if (((type->isSigned & 1U) == 0) && (*val != '-')) {
        local_40.kind = SPV_NUMBER_UNSIGNED_INT;
        local_40.bitwidth = uVar2;
        error_msg.field_2._12_4_ = uVar2;
      }
      else {
        local_40.kind = SPV_NUMBER_SIGNED_INT;
        local_40.bitwidth = uVar2;
      }
    }
    else {
      local_40.kind = SPV_NUMBER_FLOATING;
      local_40.bitwidth = uVar2;
    }
    break;
  case kScalarIntegerType:
    if ((type->isSigned & 1U) == 0) {
      local_40.kind = SPV_NUMBER_UNSIGNED_INT;
      local_40.bitwidth = type->bitwidth;
    }
    else {
      local_40.kind = SPV_NUMBER_SIGNED_INT;
      local_40.bitwidth = type->bitwidth;
    }
    break;
  case kScalarFloatType:
    local_40.kind = SPV_NUMBER_FLOATING;
    local_40.bitwidth = type->bitwidth;
    break;
  case kOtherType:
    diagnostic(&local_218,this,SPV_ERROR_INTERNAL);
    pDVar5 = DiagnosticStream::operator<<
                       (&local_218,(char (*) [32])"Unexpected numeric literal type");
    sVar1 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream(&local_218);
    return sVar1;
  }
  std::__cxx11::string::string((string *)local_270);
  local_2a8.pInst = (spv_instruction_t *)number_type;
  local_2a8.this = this;
  std::function<void(unsigned_int)>::
  function<spvtools::AssemblyContext::binaryEncodeNumericLiteral(char_const*,spv_result_t,spvtools::IdType_const&,spv_instruction_t*)::__0,void>
            ((function<void(unsigned_int)> *)&local_298,&local_2a8);
  EVar3 = utils::ParseAndEncodeNumber(val,&local_40,&local_298,(string *)local_270);
  std::function<void_(unsigned_int)>::~function(&local_298);
  local_274 = EVar3;
  switch(EVar3) {
  case kSuccess:
    this_local._4_4_ = SPV_SUCCESS;
    break;
  case kUnsupported:
    diagnostic(&local_660,this,SPV_ERROR_INTERNAL);
    pDVar5 = DiagnosticStream::operator<<
                       (&local_660,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_270);
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream(&local_660);
    break;
  case kInvalidUsage:
    diagnostic(&local_838,this,SPV_ERROR_INVALID_TEXT);
    pDVar5 = DiagnosticStream::operator<<
                       (&local_838,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_270);
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream(&local_838);
    break;
  case kInvalidText:
    diagnostic(&local_488,this,error_code);
    pDVar5 = DiagnosticStream::operator<<
                       (&local_488,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_270);
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream(&local_488);
    break;
  default:
    diagnostic(&local_a10,this,SPV_ERROR_INTERNAL);
    pDVar5 = DiagnosticStream::operator<<
                       (&local_a10,
                        (char (*) [51])"Unexpected result code from ParseAndEncodeNumber()");
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream(&local_a10);
  }
  local_2ac = 1;
  std::__cxx11::string::~string((string *)local_270);
  return this_local._4_4_;
}

Assistant:

spv_result_t AssemblyContext::binaryEncodeNumericLiteral(
    const char* val, spv_result_t error_code, const IdType& type,
    spv_instruction_t* pInst) {
  using spvtools::utils::EncodeNumberStatus;
  // Populate the NumberType from the IdType for parsing.
  spvtools::utils::NumberType number_type;
  switch (type.type_class) {
    case IdTypeClass::kOtherType:
      return diagnostic(SPV_ERROR_INTERNAL)
             << "Unexpected numeric literal type";
    case IdTypeClass::kScalarIntegerType:
      if (type.isSigned) {
        number_type = {type.bitwidth, SPV_NUMBER_SIGNED_INT};
      } else {
        number_type = {type.bitwidth, SPV_NUMBER_UNSIGNED_INT};
      }
      break;
    case IdTypeClass::kScalarFloatType:
      number_type = {type.bitwidth, SPV_NUMBER_FLOATING};
      break;
    case IdTypeClass::kBottom:
      // kBottom means the type is unknown and we need to infer the type before
      // parsing the number. The rule is: If there is a decimal point, treat
      // the value as a floating point value, otherwise a integer value, then
      // if the first char of the integer text is '-', treat the integer as a
      // signed integer, otherwise an unsigned integer.
      uint32_t bitwidth = static_cast<uint32_t>(assumedBitWidth(type));
      if (strchr(val, '.')) {
        number_type = {bitwidth, SPV_NUMBER_FLOATING};
      } else if (type.isSigned || val[0] == '-') {
        number_type = {bitwidth, SPV_NUMBER_SIGNED_INT};
      } else {
        number_type = {bitwidth, SPV_NUMBER_UNSIGNED_INT};
      }
      break;
  }

  std::string error_msg;
  EncodeNumberStatus parse_status = ParseAndEncodeNumber(
      val, number_type,
      [this, pInst](uint32_t d) { this->binaryEncodeU32(d, pInst); },
      &error_msg);
  switch (parse_status) {
    case EncodeNumberStatus::kSuccess:
      return SPV_SUCCESS;
    case EncodeNumberStatus::kInvalidText:
      return diagnostic(error_code) << error_msg;
    case EncodeNumberStatus::kUnsupported:
      return diagnostic(SPV_ERROR_INTERNAL) << error_msg;
    case EncodeNumberStatus::kInvalidUsage:
      return diagnostic(SPV_ERROR_INVALID_TEXT) << error_msg;
  }
  // This line is not reachable, only added to satisfy the compiler.
  return diagnostic(SPV_ERROR_INTERNAL)
         << "Unexpected result code from ParseAndEncodeNumber()";
}